

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronParserCtxtPtr xmlSchematronNewParserCtxt(char *URL)

{
  xmlSchematronParserCtxtPtr ctxt;
  xmlDictPtr dict;
  xmlChar *pxVar1;
  xmlXPathContextPtr pxVar2;
  
  if (URL != (char *)0x0) {
    ctxt = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x90);
    if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema parser context");
      return (xmlSchematronParserCtxtPtr)0x0;
    }
    memset(ctxt,0,0x90);
    ctxt->type = 1;
    dict = xmlDictCreate();
    ctxt->dict = dict;
    pxVar1 = xmlDictLookup(dict,(xmlChar *)URL,-1);
    ctxt->URL = pxVar1;
    ctxt->includes = (xmlNodePtr *)0x0;
    pxVar2 = xmlXPathNewContext((xmlDocPtr)0x0);
    ctxt->xctxt = pxVar2;
    if (pxVar2 != (xmlXPathContextPtr)0x0) {
      pxVar2->flags = 1;
      return ctxt;
    }
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema parser XPath context");
    xmlSchematronFreeParserCtxt(ctxt);
  }
  return (xmlSchematronParserCtxtPtr)0x0;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewParserCtxt(const char *URL)
{
    xmlSchematronParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->type = XML_STRON_CTXT_PARSER;
    ret->dict = xmlDictCreate();
    ret->URL = xmlDictLookup(ret->dict, (const xmlChar *) URL, -1);
    ret->includes = NULL;
    ret->xctxt = xmlXPathNewContext(NULL);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
        xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }
    ret->xctxt->flags = XML_XPATH_CHECKNS;
    return (ret);
}